

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O1

_Bool nni_id_visit(nni_id_map *m,uint64_t *keyp,void **valp,uint32_t *cursor)

{
  uint uVar1;
  void **ppvVar2;
  ulong uVar3;
  uint uVar4;
  void *pvVar5;
  _Bool _Var6;
  
  uVar4 = *cursor;
  uVar3 = (ulong)uVar4;
  uVar1 = m->id_cap;
  _Var6 = uVar4 < uVar1;
  if (_Var6) {
    pvVar5 = m->id_entries[uVar3].val;
    if (pvVar5 == (void *)0x0) {
      ppvVar2 = &m->id_entries[uVar3 + 1].val;
      do {
        if (uVar1 - 1 == (int)uVar3) {
          _Var6 = false;
          uVar4 = uVar1;
          goto LAB_00110f30;
        }
        pvVar5 = *ppvVar2;
        uVar3 = uVar3 + 1;
        ppvVar2 = ppvVar2 + 3;
      } while (pvVar5 == (void *)0x0);
      _Var6 = (uint)uVar3 < uVar1;
    }
    if (valp != (void **)0x0) {
      *valp = pvVar5;
    }
    if (keyp != (uint64_t *)0x0) {
      *keyp = m->id_entries[uVar3].key;
    }
    uVar4 = (int)uVar3 + 1;
  }
LAB_00110f30:
  *cursor = uVar4;
  return _Var6;
}

Assistant:

bool
nni_id_visit(nni_id_map *m, uint64_t *keyp, void **valp, uint32_t *cursor)
{
	// cursor is just a cursor into the table
	uint32_t index = *cursor;
	while (index < m->id_cap) {
		if (m->id_entries[index].val != NULL) {
			if (valp != NULL) {
				*valp = m->id_entries[index].val;
			}
			if (keyp != NULL) {
				*keyp = m->id_entries[index].key;
			}
			*cursor = index + 1;
			return true;
		}
		index++;
	}
	*cursor = index;
	return (false);
}